

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

void ptls_log__do_push_element_hexdump(char *prefix,size_t prefix_len,void *s,size_t l)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  uint8_t *src;
  long in_FS_OFFSET;
  
  iVar3 = expand_logbuf_or_invalidate(prefix,prefix_len,l * 2 + 2);
  if (iVar3 != 0) {
    lVar2 = *(long *)(in_FS_OFFSET + -0xb8);
    *(long *)(in_FS_OFFSET + -0xb8) = lVar2 + 1;
    *(undefined1 *)(*(long *)(in_FS_OFFSET + -200) + lVar2) = 0x22;
    pcVar4 = (char *)(*(long *)(in_FS_OFFSET + -200) + *(long *)(in_FS_OFFSET + -0xb8));
    if (l != 0) {
      sVar5 = 0;
      do {
        bVar1 = *(byte *)((long)s + sVar5);
        *pcVar4 = "0123456789abcdef0123456789abcdef0123456789abcdef"[(ulong)(bVar1 >> 4) + 0x20];
        pcVar4[1] = "0123456789abcdef0123456789abcdef0123456789abcdef"[(ulong)(bVar1 & 0xf) + 0x20];
        pcVar4 = pcVar4 + 2;
        sVar5 = sVar5 + 1;
      } while (l != sVar5);
    }
    *pcVar4 = '\0';
    lVar2 = *(long *)(in_FS_OFFSET + -0xb8);
    *(size_t *)(in_FS_OFFSET + -0xb8) = l * 2 + lVar2 + 1;
    *(undefined1 *)(*(long *)(in_FS_OFFSET + -200) + lVar2 + l * 2) = 0x22;
  }
  return;
}

Assistant:

void ptls_log__do_push_element_hexdump(const char *prefix, size_t prefix_len, const void *s, size_t l)
{
    if (expand_logbuf_or_invalidate(prefix, prefix_len, l * 2 + 2)) {
        logbuf.buf.base[logbuf.buf.off++] = '"';
        ptls_hexdump((char *)logbuf.buf.base + logbuf.buf.off, s, l);
        logbuf.buf.off += l * 2;
        logbuf.buf.base[logbuf.buf.off++] = '"';
    }
}